

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O1

void __thiscall PathTracerThread::path_tracer_thread_func(PathTracerThread *this)

{
  uint32_t uVar1;
  element_type *peVar2;
  int iVar3;
  uint uVar4;
  logger *plVar5;
  undefined4 extraout_var;
  shared_ptr<myvk::CommandBuffer> pt_command_buffer;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> pt_command_pool;
  unique_lock<std::mutex> local_78;
  undefined8 local_68;
  CommandBuffer local_60;
  
  plVar5 = spdlog::default_logger_raw();
  local_78._M_device = (mutex *)0x0;
  local_78._M_owns = false;
  local_78._9_7_ = 0;
  local_68 = 0;
  spdlog::logger::log(plVar5,0.0);
  myvk::Queue::WaitIdle
            ((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  iVar3 = (*(((this->m_main_queue).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar2 = (this->m_path_tracer_viewer_ptr).
           super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  myvk::CommandPool::Create
            ((CommandPool *)
             &local_60.m_command_pool_ptr.
              super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &this->m_path_tracer_queue,0);
  myvk::Fence::Create((Fence *)&local_60.super_DeviceObjectBase.super_Base.
                                super_enable_shared_from_this<myvk::Base>._M_weak_this.
                                super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),0);
  myvk::CommandBuffer::Create
            (&local_60,
             (Ptr<CommandPool> *)
             &local_60.m_command_pool_ptr.
              super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin
            ((CommandBuffer *)local_60.super_DeviceObjectBase.super_Base._vptr_Base,0);
  PathTracer::CmdRender
            ((peVar2->m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(shared_ptr<myvk::CommandBuffer> *)&local_60);
  myvk::CommandBuffer::End((CommandBuffer *)local_60.super_DeviceObjectBase.super_Base._vptr_Base);
  acquire_resources(this);
  if (((this->m_run)._M_base._M_i & 1U) != 0) {
    do {
      myvk::Fence::Reset((Fence *)local_60.super_DeviceObjectBase.super_Base.
                                  super_enable_shared_from_this<myvk::Base>._M_weak_this.
                                  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi);
      myvk::CommandBuffer::Submit
                ((CommandBuffer *)local_60.super_DeviceObjectBase.super_Base._vptr_Base,
                 (Ptr<Fence> *)
                 &local_60.super_DeviceObjectBase.super_Base.
                  super_enable_shared_from_this<myvk::Base>._M_weak_this.
                  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      myvk::Fence::Wait((Fence *)local_60.super_DeviceObjectBase.super_Base.
                                 super_enable_shared_from_this<myvk::Base>._M_weak_this.
                                 super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,0xffffffffffffffff);
      uVar1 = this->m_spp;
      this->m_spp = uVar1 + 1;
      uVar4 = uVar1 * -0x33333333;
      if ((uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x1999999a) {
        UpdateViewer(this);
      }
      while (((this->m_pause)._M_base._M_i & 1U) != 0) {
        plVar5 = spdlog::default_logger_raw();
        local_78._M_device = (mutex_type *)0x0;
        local_78._8_8_ = 0;
        local_68 = 0;
        spdlog::logger::log(plVar5,0.0);
        local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
        local_78._M_device = &(this->m_pause_semaphore).m_mtx;
        std::unique_lock<std::mutex>::lock(&local_78);
        local_78._M_owns = true;
        if ((this->m_pause_semaphore).m_state == false) {
          do {
            std::condition_variable::wait((unique_lock *)&(this->m_pause_semaphore).m_cv);
          } while ((this->m_pause_semaphore).m_state != true);
        }
        (this->m_pause_semaphore).m_state = false;
        std::unique_lock<std::mutex>::~unique_lock(&local_78);
      }
    } while (((this->m_run)._M_base._M_i & 1U) != 0);
  }
  release_resources(this);
  plVar5 = spdlog::default_logger_raw();
  local_78._M_device = (mutex_type *)0x0;
  local_78._M_owns = false;
  local_78._9_7_ = 0;
  local_68 = 0;
  spdlog::logger::log(plVar5,0.0);
  if (local_60.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
      _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>.
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_60.m_command_pool_ptr.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_60.m_command_pool_ptr.
               super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.m_command_buffer !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60.m_command_buffer);
  }
  return;
}

Assistant:

void PathTracerThread::path_tracer_thread_func() {
	spdlog::info("Enter path tracer thread");

	m_main_queue->WaitIdle();

	const std::shared_ptr<myvk::Device> &device = m_main_queue->GetDevicePtr();
	const std::shared_ptr<PathTracer> &path_tracer = m_path_tracer_viewer_ptr->GetPathTracerPtr();

	std::shared_ptr<myvk::CommandPool> pt_command_pool = myvk::CommandPool::Create(m_path_tracer_queue);

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);

	std::shared_ptr<myvk::CommandBuffer> pt_command_buffer = myvk::CommandBuffer::Create(pt_command_pool);
	pt_command_buffer->Begin();
	path_tracer->CmdRender(pt_command_buffer);
	pt_command_buffer->End();

	acquire_resources();

	while (m_run.load(std::memory_order_acquire)) {
		fence->Reset();
		pt_command_buffer->Submit(fence);
		fence->Wait();

		if ((m_spp++) % kPTResultUpdateInterval == 0)
			UpdateViewer();

		while (m_pause.load(std::memory_order_acquire)) {
			spdlog::debug("m_pause_semaphore wait");
			m_pause_semaphore.wait();
		}
	}

	release_resources();

	spdlog::info("Quit path tracer thread");
}